

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Queries::FunctionalTest::checkQueryBufferObject<long>
          (FunctionalTest *this,GLuint query,GLenum pname,long expected_value,
          _func_bool_long_long *comparison)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long *plVar5;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (*this->m_pGetQueryBufferObjecti64v)(query,this->m_bo_query,pname,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetQueryBufferObject* have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x5a7);
  plVar5 = (long *)(**(code **)(lVar4 + 0xcf8))(0x9192,35000);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glMapBuffer have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x5ab);
  bVar1 = (*comparison)(expected_value,*plVar5);
  (**(code **)(lVar4 + 0x1670))(0x9192);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glUnmapBuffer have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x5b5);
  return bVar1;
}

Assistant:

bool FunctionalTest::checkQueryBufferObject(glw::GLuint query, glw::GLenum pname, T expected_value,
											bool (*comparison)(T, T))
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Default result. */
	bool is_ok = true;

	/* Saving results to buffer. */
	GetQueryBufferObject<T>(query, m_bo_query, pname, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryBufferObject* have failed");

	/* Mapping buffer to user space. */
	T* value = (T*)gl.mapBuffer(GL_QUERY_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer have failed");

	/* Doing test. */
	if (!comparison(expected_value, *value))
	{
		is_ok = false;
	}

	/* Cleanup. */
	gl.unmapBuffer(GL_QUERY_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer have failed");

	/* Return test result. */
	return is_ok;
}